

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_d3d_light.cxx
# Opt level: O2

void __thiscall xray_re::d3d_light::save(d3d_light *this,xr_writer *w)

{
  undefined1 local_24 [4];
  
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  xr_writer::w_fcolor(w,&this->diffuse);
  xr_writer::w_fcolor(w,&this->specular);
  xr_writer::w_fcolor(w,&this->ambient);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  return;
}

Assistant:

void d3d_light::save(xr_writer& w) const
{
	w.w_u32(type);
	w.w_fcolor(diffuse);
	w.w_fcolor(specular);
	w.w_fcolor(ambient);
	w.w_float(range);
	w.w_float(falloff);
	w.w_float(attenuation0);
	w.w_float(attenuation1);
	w.w_float(attenuation2);
	w.w_float(theta);
	w.w_float(phi);
}